

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenBrOn(BinaryenModuleRef module,BinaryenOp op,char *name,BinaryenExpressionRef ref,
            BinaryenType castType)

{
  BinaryenType ref_00;
  BrOnOp op_00;
  BrOn *pBVar1;
  Type local_50;
  string_view local_48;
  Builder local_38;
  BinaryenType local_30;
  BinaryenType castType_local;
  BinaryenExpressionRef ref_local;
  char *name_local;
  BinaryenModuleRef pMStack_10;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_30 = castType;
  castType_local = (BinaryenType)ref;
  ref_local = (BinaryenExpressionRef)name;
  name_local._4_4_ = op;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_38,module);
  op_00 = name_local._4_4_;
  wasm::Name::Name((Name *)&local_48,(char *)ref_local);
  ref_00 = castType_local;
  wasm::Type::Type(&local_50,local_30);
  pBVar1 = wasm::Builder::makeBrOn(&local_38,op_00,(Name)local_48,(Expression *)ref_00,local_50);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBrOn(BinaryenModuleRef module,
                                   BinaryenOp op,
                                   const char* name,
                                   BinaryenExpressionRef ref,
                                   BinaryenType castType) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBrOn(BrOnOp(op), name, (Expression*)ref, Type(castType)));
}